

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall Minisat::Solver::litsEnqueue(Solver *this,int cutP,Clause *c)

{
  uint uVar1;
  VarData *pVVar2;
  long lVar3;
  int iVar4;
  int i;
  uint uVar5;
  
  if (cutP < (int)(SUB84(c->header,4) >> 2)) {
    lVar3 = (long)cutP;
    do {
      uVar1 = *(uint *)(&c[1].header.field_0x0 + lVar3 * 4);
      uVar5 = uVar1 ^ 1;
      iVar4 = (int)uVar1 >> 1;
      (this->assigns).data[iVar4].value = (byte)uVar5 & 1;
      pVVar2 = (this->vardata).data;
      pVVar2[iVar4].reason = 0xffffffff;
      pVVar2[iVar4].level = (this->trail_lim).sz;
      iVar4 = (this->trail).sz;
      (this->trail).sz = iVar4 + 1;
      (this->trail).data[iVar4].x = uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (long)((ulong)c->header >> 0x22));
  }
  return;
}

Assistant:

int size() const { return header.size; }